

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_SimpleArray<ON_2dPoint> *
ON_LiftToCover(ON_SimpleArray<ON_2dPoint> *__return_storage_ptr__,ON_SimpleArray<ON_2dPoint> *in,
              ON_Interval *dom,bool *closed,double normband)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ON_2dPoint OVar4;
  ON_PeriodicDomain Cover;
  ON_2dPoint local_88;
  ON_PeriodicDomain local_78;
  
  ON_PeriodicDomain::ON_PeriodicDomain(&local_78,dom,closed,normband);
  iVar1 = in->m_count;
  __return_storage_ptr__->_vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a0d8;
  __return_storage_ptr__->m_a = (ON_2dPoint *)0x0;
  __return_storage_ptr__->m_count = 0;
  __return_storage_ptr__->m_capacity = 0;
  if ((long)iVar1 != 0) {
    ON_SimpleArray<ON_2dPoint>::SetCapacity(__return_storage_ptr__,(long)iVar1);
  }
  if (0 < in->m_count) {
    lVar3 = 8;
    lVar2 = 0;
    do {
      OVar4.y = *(double *)((long)&in->m_a->x + lVar3);
      OVar4.x = *(double *)((long)in->m_a + lVar3 + -8);
      OVar4 = ON_PeriodicDomain::LiftToCover(&local_78,OVar4,false);
      local_88.y = OVar4.y;
      local_88.x = OVar4.x;
      ON_SimpleArray<ON_2dPoint>::Append(__return_storage_ptr__,&local_88);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < in->m_count);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SimpleArray<ON_2dPoint> ON_LiftToCover(
	const ON_SimpleArray<ON_2dPoint>& in,
	const ON_Interval dom[2], bool closed[2],
	double normband)
{
	ON_PeriodicDomain Cover(dom, closed, normband);
	ON_SimpleArray<ON_2dPoint> out(in.Count());
	for (int i = 0; i < in.Count(); i++)
		out.Append(Cover.LiftToCover(in[i]));

	return out;
}